

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::CalcWindowNextAutoFitSize(ImGuiWindow *window)

{
  ImVec2 IVar1;
  ImVec2 local_20;
  ImVec2 local_18;
  
  local_18.x = 0.0;
  local_18.y = 0.0;
  local_20.x = 0.0;
  local_20.y = 0.0;
  CalcWindowContentSizes(window,&local_18,&local_20);
  IVar1 = CalcWindowAutoFitSize(window,&local_20);
  IVar1 = CalcWindowSizeAfterConstraint(window,IVar1);
  return IVar1;
}

Assistant:

ImVec2 ImGui::CalcWindowNextAutoFitSize(ImGuiWindow* window)
{
    ImVec2 size_contents_current;
    ImVec2 size_contents_ideal;
    CalcWindowContentSizes(window, &size_contents_current, &size_contents_ideal);
    ImVec2 size_auto_fit = CalcWindowAutoFitSize(window, size_contents_ideal);
    ImVec2 size_final = CalcWindowSizeAfterConstraint(window, size_auto_fit);
    return size_final;
}